

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_mapper.hpp
# Opt level: O0

void __thiscall
pstore::in_memory_mapper::in_memory_mapper
          (in_memory_mapper *this,in_memory *file,bool write_enabled,uint64_t offset,uint64_t length
          )

{
  uint64_t local_30;
  uint64_t length_local;
  uint64_t offset_local;
  in_memory *piStack_18;
  bool write_enabled_local;
  in_memory *file_local;
  in_memory_mapper *this_local;
  
  local_30 = length;
  length_local = offset;
  offset_local._7_1_ = write_enabled;
  piStack_18 = file;
  file_local = (in_memory *)this;
  pointer((in_memory_mapper *)&stack0xffffffffffffffb0,file,offset);
  std::shared_ptr<void>::shared_ptr<unsigned_char,void>
            ((shared_ptr<void> *)&stack0xffffffffffffffc0,
             (shared_ptr<unsigned_char> *)&stack0xffffffffffffffb0);
  memory_mapper_base::memory_mapper_base
            (&this->super_memory_mapper_base,(shared_ptr<void> *)&stack0xffffffffffffffc0,
             (bool)(offset_local._7_1_ & 1),length_local,local_30);
  std::shared_ptr<void>::~shared_ptr((shared_ptr<void> *)&stack0xffffffffffffffc0);
  std::shared_ptr<unsigned_char>::~shared_ptr((shared_ptr<unsigned_char> *)&stack0xffffffffffffffb0)
  ;
  (this->super_memory_mapper_base)._vptr_memory_mapper_base =
       (_func_int **)&PTR__in_memory_mapper_003f9a40;
  return;
}

Assistant:

in_memory_mapper (file::in_memory & file, bool const write_enabled,
                          std::uint64_t const offset, std::uint64_t const length)
                : memory_mapper_base (pointer (file, offset), write_enabled, offset, length) {}